

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O2

void __thiscall
Diligent::DearchiverBase::NamedResourceCache<Diligent::IPipelineResourceSignature>::Set
          (NamedResourceCache<Diligent::IPipelineResourceSignature> *this,ResourceType Type,
          char *Name,IPipelineResourceSignature *pResource)

{
  IPipelineResourceSignature *Args_1;
  string msg;
  IPipelineResourceSignature *pResource_local;
  unique_lock<std::mutex> Lock;
  
  pResource_local = pResource;
  if ((Name == (char *)0x0) || (Args_1 = pResource, *Name == '\0')) {
    FormatString<char[26],char[35]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Name != nullptr && Name[0] != \'\\0\'",(char (*) [35])pResource);
    Args_1 = (IPipelineResourceSignature *)0xac;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Set",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0xac);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (pResource == (IPipelineResourceSignature *)0x0) {
    FormatString<char[26],char[21]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pResource != nullptr",
               (char (*) [21])Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Set",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0xad);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::unique_lock<std::mutex>::unique_lock(&Lock,&this->m_Mtx);
  DeviceObjectArchive::NamedResourceKey::NamedResourceKey((NamedResourceKey *)&msg,Type,Name,true);
  std::
  _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::IPipelineResourceSignature*&>
            ((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->m_Map,&msg,&pResource_local);
  HashMapStringKey::Clear((HashMapStringKey *)&msg._M_string_length);
  std::unique_lock<std::mutex>::~unique_lock(&Lock);
  return;
}

Assistant:

void DearchiverBase::NamedResourceCache<ResType>::Set(ResourceType Type, const char* Name, ResType* pResource)
{
    VERIFY_EXPR(Name != nullptr && Name[0] != '\0');
    VERIFY_EXPR(pResource != nullptr);

    std::unique_lock<std::mutex> Lock{m_Mtx};
    m_Map.emplace(NamedResourceKey{Type, Name, /*CopyName = */ true}, pResource);
}